

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O2

void TPZShapeHDivConstant<pzshape::TPZShapePrism>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  int k;
  int64_t row;
  ulong col;
  long col_00;
  int d;
  long lVar5;
  long lVar6;
  TPZVec<double> div;
  TPZFMatrix<double> curlPhiAux;
  TPZFNMatrix<12,_double> vecDiv;
  TPZFMatrix<double> phiAux;
  
  TPZFNMatrix<12,_double>::TPZFNMatrix(&vecDiv,3,5);
  TPZVec<double>::TPZVec(&div,5);
  memset(vecDiv.super_TPZFMatrix<double>.fElem,0,
         vecDiv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         vecDiv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  vecDiv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  phiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::Fill(&div,(double *)&phiAux,0,-1);
  pztopology::TPZPrism::ComputeConstantHDiv(pt,&vecDiv.super_TPZFMatrix<double>,&div);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  uVar2 = pztopology::TPZPrism::NumSides(1);
  col = (ulong)uVar2;
  iVar3 = TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::NHCurlShapeF(data);
  NHDivShapeF(data);
  TPZFMatrix<double>::TPZFMatrix(&phiAux,3,(long)iVar3);
  TPZFMatrix<double>::TPZFMatrix(&curlPhiAux,3,(long)iVar3);
  memset(phiAux.fElem,0,
         phiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         phiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  phiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  memset(curlPhiAux.fElem,0,
         curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Shape(pt,data,&phiAux,&curlPhiAux);
  lVar6 = 0;
  col_00 = 0;
  while( true ) {
    col_00 = (long)(int)col_00;
    if (lVar6 == 5) break;
    col = (ulong)(int)col;
    for (row = 0; row != 3; row = row + 1) {
      pdVar4 = TPZFMatrix<double>::operator()(&vecDiv.super_TPZFMatrix<double>,row,lVar6);
      dVar1 = *pdVar4;
      iVar3 = (data->fSideOrient).super_TPZVec<int>.fStore[lVar6];
      pdVar4 = TPZFMatrix<double>::operator()(phi,row,col_00);
      *pdVar4 = dVar1 * (double)iVar3;
    }
    dVar1 = div.fStore[lVar6];
    iVar3 = (data->fSideOrient).super_TPZVec<int>.fStore[lVar6];
    pdVar4 = TPZFMatrix<double>::operator()(divphi,col_00,0);
    *pdVar4 = dVar1 * (double)iVar3;
    for (iVar3 = 0; col_00 = col_00 + 1,
        iVar3 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[(int)uVar2]; iVar3 = iVar3 + 1
        ) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        pdVar4 = TPZFMatrix<double>::operator()(&curlPhiAux,lVar5,col);
        dVar1 = *pdVar4;
        pdVar4 = TPZFMatrix<double>::operator()(phi,lVar5,col_00);
        *pdVar4 = dVar1;
      }
      col = col + 1;
    }
    lVar6 = lVar6 + 1;
  }
  lVar6 = (long)(int)col;
  for (iVar3 = 0; iVar3 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[0xe];
      iVar3 = iVar3 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()(&curlPhiAux,lVar5,lVar6);
      dVar1 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(phi,lVar5,col_00);
      *pdVar4 = dVar1;
    }
    lVar6 = lVar6 + 1;
    col_00 = col_00 + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix(&curlPhiAux);
  TPZFMatrix<double>::~TPZFMatrix(&phiAux);
  TPZVec<double>::~TPZVec(&div);
  TPZFNMatrix<12,_double>::~TPZFNMatrix(&vecDiv);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}